

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

IndirOpnd * __thiscall
Lowerer::GetArgsIndirOpndForTopFunction(Lowerer *this,Instr *ldElem,Opnd *valueOpnd)

{
  code *pcVar1;
  bool bVar2;
  byte scale;
  JITTimeFunctionBody *pJVar3;
  RegOpnd *pRVar4;
  undefined4 *puVar5;
  IntConstOpnd *pIVar6;
  IndirOpnd *pIVar7;
  RegOpnd *indexOpnd;
  int iVar8;
  int iVar9;
  
  pJVar3 = Func::GetJITFunctionBody(this->m_func);
  bVar2 = JITTimeFunctionBody::IsCoroutine(pJVar3);
  if (bVar2) {
    pRVar4 = LoadGeneratorArgsPtr(ldElem);
  }
  else {
    pRVar4 = IR::Opnd::CreateFramePointerOpnd(this->m_func);
  }
  pJVar3 = Func::GetJITFunctionBody(this->m_func);
  bVar2 = JITTimeFunctionBody::IsCoroutine(pJVar3);
  if (bVar2) {
    pJVar3 = Func::GetJITFunctionBody(this->m_func);
    bVar2 = JITTimeFunctionBody::IsGenerator(pJVar3);
    iVar8 = 1;
    iVar9 = 1;
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x5666,
                         "(actualOffset == 5 || m_func->GetJITFunctionBody()->IsGenerator())",
                         "actualOffset == 5 || m_func->GetJITFunctionBody()->IsGenerator()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
  }
  else {
    iVar8 = 5;
    iVar9 = 5;
  }
  bVar2 = IR::Opnd::IsIntConstOpnd(valueOpnd);
  if (bVar2) {
    pIVar6 = IR::Opnd::AsIntConstOpnd(valueOpnd);
    pIVar7 = IR::IndirOpnd::New(pRVar4,(iVar8 + (int)(pIVar6->super_EncodableOpnd<long>).m_value) *
                                       8,TyInt64,this->m_func,false);
    return pIVar7;
  }
  scale = LowererMDArch::GetDefaultIndirScale();
  pRVar4 = IR::Opnd::AsRegOpnd(&pRVar4->super_Opnd);
  indexOpnd = IR::Opnd::AsRegOpnd(valueOpnd);
  pIVar7 = IR::IndirOpnd::New(pRVar4,indexOpnd,scale,TyInt64,this->m_func);
  pIVar7->m_offset = iVar9 << (scale & 0x1f);
  (pIVar7->super_Opnd).field_0xe = 0;
  return pIVar7;
}

Assistant:

IR::IndirOpnd*
Lowerer::GetArgsIndirOpndForTopFunction(IR::Instr* ldElem, IR::Opnd* valueOpnd)
{
    // Load argument set dst = [ebp + index] (or grab from the generator object if m_func is a generator function).
    IR::RegOpnd *baseOpnd = m_func->GetJITFunctionBody()->IsCoroutine() ? LoadGeneratorArgsPtr(ldElem) : IR::Opnd::CreateFramePointerOpnd(m_func);
    IR::IndirOpnd* argIndirOpnd = nullptr;
    // The stack looks like this:
    //       ...
    //       arguments[1]
    //       arguments[0]
    //       this
    //       callinfo
    //       function object
    //       return addr
    // EBP-> EBP chain

    //actual arguments offset is LowererMD::GetFormalParamOffset() + 1 (this)

    uint16 actualOffset = m_func->GetJITFunctionBody()->IsCoroutine() ? 1 : GetFormalParamOffset() + 1; //5
    Assert(actualOffset == 5 || m_func->GetJITFunctionBody()->IsGenerator());
    if (valueOpnd->IsIntConstOpnd())
    {
        IntConstType offset = (valueOpnd->AsIntConstOpnd()->GetValue() + actualOffset) * MachPtr;
        // TODO: Assert(Math::FitsInDWord(offset));
        argIndirOpnd = IR::IndirOpnd::New(baseOpnd, (int32)offset, TyMachReg, this->m_func);
    }
    else
    {
        const BYTE indirScale = this->m_lowererMD.GetDefaultIndirScale();
        argIndirOpnd = IR::IndirOpnd::New(baseOpnd->AsRegOpnd(), valueOpnd->AsRegOpnd(), indirScale, TyMachReg, this->m_func);

        // Need to offset valueOpnd by 5. Instead of changing valueOpnd, we can just add an offset to the indir. Changing
        // valueOpnd requires creation of a temp sym (if it's not already a temp) so that the value of the sym that
        // valueOpnd represents is not changed.
        argIndirOpnd->SetOffset(actualOffset << indirScale);
    }
    return argIndirOpnd;
}